

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_lshd(mp_int *a,int b)

{
  mp_digit *pmVar1;
  long lVar2;
  int iVar3;
  
  if (b < 1) {
    return 0;
  }
  iVar3 = a->used + b;
  if (a->alloc < iVar3) {
    iVar3 = mp_grow(a,iVar3);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = a->used + b;
  }
  a->used = iVar3;
  pmVar1 = a->dp;
  for (lVar2 = (long)iVar3; b < (int)lVar2; lVar2 = lVar2 + -1) {
    pmVar1[lVar2 + -1] = pmVar1[(lVar2 + -1) - (ulong)(uint)b];
  }
  for (lVar2 = 0; b != (int)lVar2; lVar2 = lVar2 + 1) {
    pmVar1[lVar2] = 0;
  }
  return 0;
}

Assistant:

int mp_lshd (mp_int * a, int b)
{
  int     x, res;

  /* if its less than zero return */
  if (b <= 0) {
    return MP_OKAY;
  }

  /* grow to fit the new digits */
  if (a->alloc < a->used + b) {
     if ((res = mp_grow (a, a->used + b)) != MP_OKAY) {
       return res;
     }
  }

  {
    register mp_digit *top, *bottom;

    /* increment the used by the shift amount then copy upwards */
    a->used += b;

    /* top */
    top = a->dp + a->used - 1;

    /* base */
    bottom = a->dp + a->used - 1 - b;

    /* much like mp_rshd this is implemented using a sliding window
     * except the window goes the otherway around.  Copying from
     * the bottom to the top.  see bn_mp_rshd.c for more info.
     */
    for (x = a->used - 1; x >= b; x--) {
      *top-- = *bottom--;
    }

    /* zero the lower digits */
    top = a->dp;
    for (x = 0; x < b; x++) {
      *top++ = 0;
    }
  }
  return MP_OKAY;
}